

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O2

RABlockVisitItem __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
          (ZoneStack<asmjit::v1_14::RABlockVisitItem> *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  RABlockVisitItem RVar7;
  
  if (*(long *)this == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xd4,"isInitialized()");
  }
  bVar6 = ZoneStackBase::empty(&this->super_ZoneStackBase);
  if (bVar6) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xd5,"!empty()");
  }
  lVar2 = *(long *)&this->field_0x10;
  uVar3 = *(ulong *)(lVar2 + 0x10);
  uVar4 = *(ulong *)(lVar2 + 0x18);
  if (uVar3 == uVar4) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xd8,"!block->empty()");
  }
  uVar1 = uVar4 - 0x10;
  if (lVar2 + 0x20U <= uVar1) {
    if (uVar3 <= uVar1) {
      auVar5 = *(undefined1 (*) [12])(uVar4 - 0x10);
      *(ulong *)(lVar2 + 0x18) = uVar1;
      if (uVar1 == uVar3) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,1,0x110);
      }
      RVar7._12_4_ = 0;
      RVar7._0_12_ = auVar5;
      return RVar7;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xdd,"ptr >= block->start<T>()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
             ,0xdc,"ptr >= block->data<T>()");
}

Assistant:

inline T pop() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexLast];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->end<T>();
    T item = *--ptr;
    ASMJIT_ASSERT(ptr >= block->data<T>());
    ASMJIT_ASSERT(ptr >= block->start<T>());

    block->setEnd(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexLast, kMidBlockIndex);

    return item;
  }